

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<char,_false>_> *
immutable::rrb_details::copy_first_k<char,false,6>
          (ref<immutable::rrb<char,_false,_6>_> *in,ref<immutable::rrb<char,_false,_6>_> *new_rrb,
          uint32_t k,uint32_t tail_size)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  rrb<char,_false,_6> *prVar3;
  internal_node<char,_false> *piVar4;
  rrb_size_table<false> *prVar5;
  uint uVar6;
  uint local_74;
  uint32_t child_index;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_68;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_60 [3];
  ref<immutable::rrb_details::internal_node<char,_false>_> local_48;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_current;
  uint32_t local_38;
  uint32_t i;
  uint32_t shift;
  uint32_t index;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  uint32_t tail_size_local;
  uint32_t k_local;
  ref<immutable::rrb<char,_false,_6>_> *new_rrb_local;
  ref<immutable::rrb<char,_false,_6>_> *in_local;
  
  current.ptr._0_4_ = tail_size;
  current.ptr._4_4_ = k;
  prVar3 = ref<immutable::rrb<char,_false,_6>_>::operator->(in);
  ref<immutable::rrb_details::internal_node<char,false>>::
  ref<immutable::rrb_details::tree_node<char,false>>
            ((ref<immutable::rrb_details::internal_node<char,false>> *)&to_set,&prVar3->root);
  prVar3 = ref<immutable::rrb<char,_false,_6>_>::operator->(new_rrb);
  _shift = &prVar3->root;
  prVar3 = ref<immutable::rrb<char,_false,_6>_>::operator->(in);
  i = prVar3->cnt - 1;
  prVar3 = ref<immutable::rrb<char,_false,_6>_>::operator->(in);
  local_38 = prVar3->shift;
  new_current.ptr._4_4_ = 1;
  while (new_current.ptr._4_4_ <= current.ptr._4_4_ && local_38 != 0) {
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&local_48);
    if (new_current.ptr._4_4_ == current.ptr._4_4_) {
      piVar4 = internal_node_inc<char,false>((internal_node<char,_false> *)to_set);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 &stack0xffffffffffffff90,piVar4);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (&local_48,
                 (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 &stack0xffffffffffffff90);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 &stack0xffffffffffffff90);
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
      if ((piVar4->size_table).ptr != (rrb_size_table<false> *)0x0) {
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar4->size_table);
        puVar1 = prVar5->size;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        uVar2 = puVar1[piVar4->len - 2] + (uint32_t)current.ptr;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar4->size_table);
        puVar1 = prVar5->size;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        puVar1[piVar4->len - 1] = uVar2;
      }
    }
    else {
      piVar4 = internal_node_clone<char,false>((internal_node<char,_false> *)to_set);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref(local_60,piVar4);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=(&local_48,local_60);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(local_60);
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
      if ((piVar4->size_table).ptr != (rrb_size_table<false> *)0x0) {
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        prVar5 = (piVar4->size_table).ptr;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        prVar5 = size_table_clone<false>(prVar5,piVar4->len);
        ref<immutable::rrb_details::rrb_size_table<false>_>::ref(&local_68,prVar5);
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar4->size_table,&local_68);
        ref<immutable::rrb_details::rrb_size_table<false>_>::~ref(&local_68);
        uVar2 = (uint32_t)current.ptr;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar4->size_table);
        puVar1 = prVar5->size;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
        uVar6 = piVar4->len - 1;
        puVar1[uVar6] = uVar2 + puVar1[uVar6];
      }
    }
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)_shift,&local_48);
    piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
    if ((piVar4->size_table).ptr == (rrb_size_table<false> *)0x0) {
      local_74 = i >> ((byte)local_38 & 0x1f) & 0x3f;
    }
    else {
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
      uVar2 = piVar4->len;
      local_74 = uVar2 - 1;
      if (local_74 != 0) {
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar4->size_table);
        i = i - prVar5->size[uVar2 - 2];
      }
    }
    piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_48);
    _shift = (ref<immutable::rrb_details::tree_node<char,_false>_> *)(piVar4->child + local_74);
    piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
    if (local_74 < piVar4->len) {
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set,
                 piVar4->child + local_74);
    }
    new_current.ptr._4_4_ = new_current.ptr._4_4_ + 1;
    local_38 = local_38 - 6;
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_48);
  }
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&to_set);
  return (ref<immutable::rrb_details::internal_node<char,_false>_> *)_shift;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* copy_first_k(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const uint32_t k, const uint32_t tail_size)
      {
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
      uint32_t index = in->cnt - 1;
      uint32_t shift = in->shift;

      // Copy all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, copy current node and stick it in.
        ref<internal_node<T, atomic_ref_counting>> new_current;
        if (i != k)
          {
          new_current = internal_node_clone(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table = size_table_clone(new_current->size_table.ptr, new_current->len);
            new_current->size_table->size[new_current->len - 1] += tail_size;
            }
          }
        else
          { // increment size of last element -- will only happen if we append empties
          new_current = internal_node_inc(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table->size[new_current->len - 1] = new_current->size_table->size[new_current->len - 2] + tail_size;
            }
          }
        *to_set = new_current;

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = new_current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &new_current->child[child_index];
        if (child_index < current->len)
          current = current->child[child_index];

        i++;
        shift -= bits<N>::rrb_bits;
        }
      return to_set;
      }